

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O2

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateFunctionCallExpr
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          FunctionCallAST *FuncCall)

{
  string *__k;
  const_iterator cVar1;
  iterator iVar2;
  undefined8 extraout_RAX;
  CMMInterpreter *this_00;
  VariableEnv *Env_00;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> Args;
  undefined1 local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __k = &FuncCall->Callee;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>_>
          ::find(&this->UserFunctionMap->_M_t,__k);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->UserFunctionMap->_M_t)._M_impl.super__Rb_tree_header) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>_>
            ::find(&(this->NativeFunctionMap)._M_t,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &(this->NativeFunctionMap)._M_t._M_impl.super__Rb_tree_header) {
      std::operator+(&local_50,"function `",__k);
      this_00 = (CMMInterpreter *)local_70;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     &local_50,"\' is undefined");
      RuntimeError(this_00,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&local_50);
      _Unwind_Resume(extraout_RAX);
    }
    evaluateArgumentList
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_70,this,Env,
               &FuncCall->Arguments);
    (**(code **)(iVar2._M_node + 2))
              (__return_storage_ptr__,
               (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_70);
  }
  else {
    evaluateArgumentList
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_70,this,Env,
               &FuncCall->Arguments);
    Env_00 = (VariableEnv *)0x0;
    if ((FuncCall->field_0x48 & 1) != 0) {
      Env_00 = Env;
    }
    callUserFunction(__return_storage_ptr__,this,(FunctionDefinitionAST *)(cVar1._M_node + 2),
                     (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_70,Env_00);
  }
  std::__cxx11::_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::_M_clear
            ((_List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateFunctionCallExpr(VariableEnv *Env,
                                         const FunctionCallAST *FuncCall) {
  auto UserFuncIt = UserFunctionMap.find(FuncCall->getCallee());
  if (UserFuncIt != UserFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callUserFunction(UserFuncIt->second, Args,
                            FuncCall->isDynamicBound() ? Env : nullptr);
  }

  auto NativeFuncIt = NativeFunctionMap.find(FuncCall->getCallee());
  if (NativeFuncIt != NativeFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callNativeFunction(NativeFuncIt->second, Args);
  }

  RuntimeError("function `" + FuncCall->getCallee() + "' is undefined");
  return evaluateFunctionCallExpr(nullptr, nullptr); // Make the compiler happy.
}